

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint uVar21;
  undefined4 uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  _func_int **pp_Var26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  NodeRef nodeRef;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar41;
  vint4 ai_1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_3;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_1;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 ai_2;
  undefined1 auVar54 [16];
  vint4 bi_2;
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  vint<4> mask;
  vint4 bi_8;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  AccelData *local_26f8;
  ulong local_26f0;
  RayHitK<4> *local_26e8;
  RayQueryContext *local_26e0;
  ulong local_26d8;
  long local_26d0;
  long local_26c8;
  ulong local_26c0;
  ulong local_26b8;
  undefined1 local_26b0 [16];
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float local_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  undefined1 local_2670 [16];
  RTCIntersectFunctionNArguments local_2660;
  Geometry *local_2630;
  undefined8 local_2628;
  RTCIntersectArguments *local_2620;
  undefined4 local_2610;
  undefined4 uStack_260c;
  undefined4 uStack_2608;
  undefined4 uStack_2604;
  undefined1 local_2600 [16];
  float local_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float local_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  uint local_2580;
  uint uStack_257c;
  uint uStack_2578;
  uint uStack_2574;
  uint uStack_2570;
  uint uStack_256c;
  uint uStack_2568;
  uint uStack_2564;
  undefined4 local_2560;
  undefined4 uStack_255c;
  undefined4 uStack_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  uint local_2540;
  uint uStack_253c;
  uint uStack_2538;
  uint uStack_2534;
  uint uStack_2530;
  uint uStack_252c;
  uint uStack_2528;
  uint uStack_2524;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  uint local_2500;
  uint uStack_24fc;
  uint uStack_24f8;
  uint uStack_24f4;
  uint uStack_24f0;
  uint uStack_24ec;
  uint uStack_24e8;
  uint uStack_24e4;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  uint local_24c0;
  uint uStack_24bc;
  uint uStack_24b8;
  uint uStack_24b4;
  uint uStack_24b0;
  uint uStack_24ac;
  uint uStack_24a8;
  uint uStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  uint local_2480;
  uint uStack_247c;
  uint uStack_2478;
  uint uStack_2474;
  uint uStack_2470;
  uint uStack_246c;
  uint uStack_2468;
  uint uStack_2464;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined1 local_2440 [32];
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  uint local_2400;
  uint uStack_23fc;
  uint uStack_23f8;
  uint uStack_23f4;
  uint uStack_23f0;
  uint uStack_23ec;
  uint uStack_23e8;
  uint uStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined4 local_23c0;
  undefined4 uStack_23bc;
  undefined4 uStack_23b8;
  undefined4 uStack_23b4;
  undefined4 uStack_23b0;
  undefined4 uStack_23ac;
  undefined4 uStack_23a8;
  undefined4 uStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar36 [64];
  
  auVar40 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar34 = vpcmpeqd_avx(auVar40,(undefined1  [16])valid_i->field_0);
  uVar21 = vmovmskps_avx(auVar34);
  if (uVar21 == 0) {
    return;
  }
  local_26f8 = This->ptr;
  local_26f0 = (ulong)(uVar21 & 0xff);
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  auVar33 = *(undefined1 (*) [16])(ray + 0x40);
  auVar4 = vandps_avx(auVar33,auVar42);
  auVar48._8_4_ = 0x219392ef;
  auVar48._0_8_ = 0x219392ef219392ef;
  auVar48._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar48,1);
  auVar43 = vblendvps_avx(auVar33,auVar48,auVar4);
  auVar4 = *(undefined1 (*) [16])(ray + 0x50);
  auVar46 = vandps_avx(auVar4,auVar42);
  auVar46 = vcmpps_avx(auVar46,auVar48,1);
  auVar45 = vblendvps_avx(auVar4,auVar48,auVar46);
  auVar46 = *(undefined1 (*) [16])(ray + 0x60);
  auVar42 = vandps_avx(auVar46,auVar42);
  auVar42 = vcmpps_avx(auVar42,auVar48,1);
  auVar42 = vblendvps_avx(auVar46,auVar48,auVar42);
  auVar48 = vrcpps_avx(auVar43);
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = 0x3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar43,auVar48,auVar54);
  local_25a0 = vfmadd132ps_fma(auVar43,auVar48,auVar48);
  auVar59 = ZEXT1664(local_25a0);
  auVar43 = vrcpps_avx(auVar45);
  auVar45 = vfnmadd213ps_fma(auVar45,auVar43,auVar54);
  local_25b0 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar60 = ZEXT1664(local_25b0);
  auVar43 = vrcpps_avx(auVar42);
  auVar42 = vfnmadd213ps_fma(auVar42,auVar43,auVar54);
  local_25c0 = vfmadd132ps_fma(auVar42,auVar43,auVar43);
  auVar61 = ZEXT1664(local_25c0);
  auVar42 = ZEXT816(0) << 0x20;
  local_26b0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar42);
  local_2600 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar42);
  auVar33 = vcmpps_avx(auVar33,auVar42,1);
  auVar43._8_4_ = 1;
  auVar43._0_8_ = 0x100000001;
  auVar43._12_4_ = 1;
  auVar33 = vandps_avx(auVar33,auVar43);
  auVar4 = vcmpps_avx(auVar4,auVar42,1);
  auVar45._8_4_ = 2;
  auVar45._0_8_ = 0x200000002;
  auVar45._12_4_ = 2;
  auVar4 = vandps_avx(auVar4,auVar45);
  auVar4 = vorps_avx(auVar4,auVar33);
  auVar33 = vcmpps_avx(auVar46,auVar42,1);
  auVar46._8_4_ = 4;
  auVar46._0_8_ = 0x400000004;
  auVar46._12_4_ = 4;
  auVar33 = vandps_avx(auVar33,auVar46);
  auVar40 = vpor_avx(auVar34 ^ auVar40,auVar33);
  local_2670 = vpor_avx(auVar40,auVar4);
  local_25d0 = *(float *)ray;
  fStack_25cc = *(float *)(ray + 4);
  fStack_25c8 = *(float *)(ray + 8);
  fStack_25c4 = *(float *)(ray + 0xc);
  local_2680 = local_25a0._0_4_ * -*(float *)ray;
  fStack_267c = local_25a0._4_4_ * -*(float *)(ray + 4);
  fStack_2678 = local_25a0._8_4_ * -*(float *)(ray + 8);
  fStack_2674 = local_25a0._12_4_ * -*(float *)(ray + 0xc);
  local_25e0 = *(float *)(ray + 0x10);
  fStack_25dc = *(float *)(ray + 0x14);
  fStack_25d8 = *(float *)(ray + 0x18);
  fStack_25d4 = *(float *)(ray + 0x1c);
  local_2690 = local_25b0._0_4_ * -*(float *)(ray + 0x10);
  fStack_268c = local_25b0._4_4_ * -*(float *)(ray + 0x14);
  fStack_2688 = local_25b0._8_4_ * -*(float *)(ray + 0x18);
  fStack_2684 = local_25b0._12_4_ * -*(float *)(ray + 0x1c);
  local_25f0 = *(float *)(ray + 0x20);
  fStack_25ec = *(float *)(ray + 0x24);
  fStack_25e8 = *(float *)(ray + 0x28);
  fStack_25e4 = *(float *)(ray + 0x2c);
  local_26a0 = local_25c0._0_4_ * -*(float *)(ray + 0x20);
  fStack_269c = local_25c0._4_4_ * -*(float *)(ray + 0x24);
  fStack_2698 = local_25c0._8_4_ * -*(float *)(ray + 0x28);
  fStack_2694 = local_25c0._12_4_ * -*(float *)(ray + 0x2c);
  auVar62 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_2580 = 0x80000000;
  uStack_257c = 0x80000000;
  uStack_2578 = 0x80000000;
  uStack_2574 = 0x80000000;
  uStack_2570 = 0x80000000;
  uStack_256c = 0x80000000;
  uStack_2568 = 0x80000000;
  uStack_2564 = 0x80000000;
  local_2610 = 0x7f800000;
  uStack_260c = 0x7f800000;
  uStack_2608 = 0x7f800000;
  uStack_2604 = 0x7f800000;
  local_26e8 = ray;
  local_26e0 = context;
LAB_016879bc:
  lVar10 = 0;
  for (uVar30 = local_26f0; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar10 = lVar10 + 1;
  }
  uVar22 = *(undefined4 *)(local_2670 + lVar10 * 4);
  auVar34._4_4_ = uVar22;
  auVar34._0_4_ = uVar22;
  auVar34._8_4_ = uVar22;
  auVar34._12_4_ = uVar22;
  auVar37 = vpcmpeqd_avx(auVar34,local_2670);
  uVar22 = vmovmskps_avx(auVar37);
  auVar6._4_4_ = fStack_25cc;
  auVar6._0_4_ = local_25d0;
  auVar6._8_4_ = fStack_25c8;
  auVar6._12_4_ = fStack_25c4;
  auVar42 = auVar62._0_16_;
  auVar40 = vblendvps_avx(auVar42,auVar6,auVar37);
  local_26f0 = ~CONCAT44((int)((ulong)lVar10 >> 0x20),uVar22) & local_26f0;
  auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar34,auVar40);
  auVar34 = vshufpd_avx(auVar40,auVar40,1);
  auVar34 = vminps_avx(auVar34,auVar40);
  auVar4._4_4_ = fStack_25dc;
  auVar4._0_4_ = local_25e0;
  auVar4._8_4_ = fStack_25d8;
  auVar4._12_4_ = fStack_25d4;
  auVar40 = vblendvps_avx(auVar42,auVar4,auVar37);
  auVar33 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar33,auVar40);
  auVar33 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vminps_avx(auVar33,auVar40);
  auVar34 = vinsertps_avx(auVar34,auVar40,0x1c);
  auVar5._4_4_ = fStack_25ec;
  auVar5._0_4_ = local_25f0;
  auVar5._8_4_ = fStack_25e8;
  auVar5._12_4_ = fStack_25e4;
  auVar40 = vblendvps_avx(auVar42,auVar5,auVar37);
  auVar33 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar33,auVar40);
  auVar33 = vshufpd_avx(auVar40,auVar40,1);
  auVar33 = vminps_avx(auVar33,auVar40);
  auVar55._8_4_ = 0xff800000;
  auVar55._0_8_ = 0xff800000ff800000;
  auVar55._12_4_ = 0xff800000;
  auVar40 = vblendvps_avx(auVar55,auVar6,auVar37);
  auVar33 = vinsertps_avx(auVar34,auVar33,0x20);
  auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar34,auVar40);
  auVar34 = vshufpd_avx(auVar40,auVar40,1);
  auVar34 = vmaxps_avx(auVar34,auVar40);
  auVar40 = vblendvps_avx(auVar55,auVar4,auVar37);
  auVar4 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar4,auVar40);
  auVar4 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxps_avx(auVar4,auVar40);
  auVar34 = vinsertps_avx(auVar34,auVar40,0x1c);
  auVar40 = vblendvps_avx(auVar55,auVar5,auVar37);
  auVar4 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar4,auVar40);
  auVar4 = vshufpd_avx(auVar40,auVar40,1);
  auVar4 = vmaxps_avx(auVar4,auVar40);
  auVar40 = vblendvps_avx(auVar42,auVar59._0_16_,auVar37);
  auVar46 = vinsertps_avx(auVar34,auVar4,0x20);
  auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar34,auVar40);
  auVar34 = vshufpd_avx(auVar40,auVar40,1);
  auVar34 = vminps_avx(auVar34,auVar40);
  auVar40 = vblendvps_avx(auVar42,auVar60._0_16_,auVar37);
  auVar4 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar4,auVar40);
  auVar4 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vminps_avx(auVar4,auVar40);
  auVar34 = vinsertps_avx(auVar34,auVar40,0x1c);
  auVar40 = vblendvps_avx(auVar42,auVar61._0_16_,auVar37);
  auVar4 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar4,auVar40);
  auVar4 = vshufpd_avx(auVar40,auVar40,1);
  auVar4 = vminps_avx(auVar4,auVar40);
  auVar40 = vblendvps_avx(auVar55,auVar59._0_16_,auVar37);
  auVar42 = vinsertps_avx(auVar34,auVar4,0x20);
  auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar34,auVar40);
  auVar34 = vshufpd_avx(auVar40,auVar40,1);
  auVar34 = vmaxps_avx(auVar34,auVar40);
  auVar40 = vblendvps_avx(auVar55,auVar60._0_16_,auVar37);
  auVar4 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar4,auVar40);
  auVar4 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxps_avx(auVar4,auVar40);
  auVar34 = vinsertps_avx(auVar34,auVar40,0x1c);
  auVar40 = vblendvps_avx(auVar55,auVar61._0_16_,auVar37);
  auVar4 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vmaxps_avx(auVar4,auVar40);
  auVar4 = vshufpd_avx(auVar40,auVar40,1);
  auVar4 = vmaxps_avx(auVar4,auVar40);
  auVar51._8_4_ = 0x7f800000;
  auVar51._0_8_ = 0x7f8000007f800000;
  auVar51._12_4_ = 0x7f800000;
  auVar40 = vblendvps_avx(auVar51,local_26b0,auVar37);
  auVar43 = vinsertps_avx(auVar34,auVar4,0x20);
  auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar48 = vminps_avx(auVar34,auVar40);
  auVar5 = vshufpd_avx(auVar48,auVar48,1);
  local_2720 = vblendvps_avx(auVar55,local_2600,auVar37);
  auVar45 = vshufps_avx(local_2720,local_2720,0xb1);
  auVar4 = vcmpps_avx(auVar42,_DAT_01f45a50,5);
  auVar40 = vblendvps_avx(auVar43,auVar42,auVar4);
  auVar34 = vblendvps_avx(auVar33,auVar46,auVar4);
  auVar45 = vmaxps_avx(auVar45,local_2720);
  auVar33 = vblendvps_avx(auVar46,auVar33,auVar4);
  local_23e0 = auVar40._0_4_;
  auVar54 = vmovshdup_avx(auVar40);
  local_26b8 = (ulong)(auVar54._0_4_ < 0.0) << 5 | 0x40;
  auVar46 = vshufpd_avx(auVar40,auVar40,1);
  auVar6 = vshufpd_avx(auVar45,auVar45,1);
  uVar32 = (ulong)(auVar46._0_4_ < 0.0) << 5 | 0x80;
  local_26c0 = local_26b8 ^ 0x20;
  auVar48 = vminps_avx(auVar5,auVar48);
  auVar46 = vmaxss_avx(auVar6,auVar45);
  auVar58 = ZEXT1664(CONCAT412(fStack_2674,CONCAT48(fStack_2678,CONCAT44(fStack_267c,local_2680))));
  auVar4 = vblendvps_avx(auVar42,auVar43,auVar4);
  auVar49._0_4_ = auVar34._0_4_ * local_23e0;
  auVar49._4_4_ = auVar34._4_4_ * auVar40._4_4_;
  auVar49._8_4_ = auVar34._8_4_ * auVar40._8_4_;
  auVar49._12_4_ = auVar34._12_4_ * auVar40._12_4_;
  auVar56 = ZEXT1664(CONCAT412(fStack_2684,CONCAT48(fStack_2688,CONCAT44(fStack_268c,local_2690))));
  local_24a0 = auVar4._0_4_;
  auVar52._0_4_ = auVar33._0_4_ * local_24a0;
  auVar52._4_4_ = auVar33._4_4_ * auVar4._4_4_;
  auVar52._8_4_ = auVar33._8_4_ * auVar4._8_4_;
  auVar52._12_4_ = auVar33._12_4_ * auVar4._12_4_;
  auVar57 = ZEXT1664(CONCAT412(fStack_2694,CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
  uVar30 = (ulong)(local_23e0 < 0.0) << 5;
  uVar31 = uVar30 ^ 0x20;
  local_23a0 = *(ulong *)&local_26f8[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  fStack_23dc = local_23e0;
  fStack_23d8 = local_23e0;
  fStack_23d4 = local_23e0;
  fStack_23d0 = local_23e0;
  fStack_23cc = local_23e0;
  fStack_23c8 = local_23e0;
  fStack_23c4 = local_23e0;
  local_2400 = (uint)auVar49._0_4_ ^ local_2580;
  uStack_23fc = (uint)auVar49._0_4_ ^ uStack_257c;
  uStack_23f8 = (uint)auVar49._0_4_ ^ uStack_2578;
  uStack_23f4 = (uint)auVar49._0_4_ ^ uStack_2574;
  uStack_23f0 = (uint)auVar49._0_4_ ^ uStack_2570;
  uStack_23ec = (uint)auVar49._0_4_ ^ uStack_256c;
  uStack_23e8 = (uint)auVar49._0_4_ ^ uStack_2568;
  uStack_23e4 = (uint)auVar49._0_4_ ^ uStack_2564;
  local_2420 = auVar54._0_8_;
  uStack_2418 = local_2420;
  uStack_2410 = local_2420;
  uStack_2408 = local_2420;
  auVar34 = vmovshdup_avx(auVar49);
  uVar21 = auVar34._0_4_;
  local_2440._0_4_ = uVar21 ^ local_2580;
  uVar41 = auVar34._4_4_;
  local_2440._4_4_ = uVar41 ^ uStack_257c;
  local_2440._8_4_ = uVar21 ^ uStack_2578;
  local_2440._12_4_ = uVar41 ^ uStack_2574;
  local_2440._16_4_ = uVar21 ^ uStack_2570;
  local_2440._20_4_ = uVar41 ^ uStack_256c;
  local_2440._24_4_ = uVar21 ^ uStack_2568;
  local_2440._28_4_ = uVar41 ^ uStack_2564;
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  local_2460 = auVar40._0_8_;
  uStack_2458 = local_2460;
  uStack_2450 = local_2460;
  uStack_2448 = local_2460;
  auVar40 = vshufps_avx(auVar49,auVar49,0xaa);
  uVar21 = auVar40._0_4_;
  uVar41 = auVar40._4_4_;
  local_2480 = uVar21 ^ local_2580;
  uStack_247c = uVar41 ^ uStack_257c;
  uStack_2478 = uVar21 ^ uStack_2578;
  uStack_2474 = uVar41 ^ uStack_2574;
  uStack_2470 = uVar21 ^ uStack_2570;
  uStack_246c = uVar41 ^ uStack_256c;
  uStack_2468 = uVar21 ^ uStack_2568;
  uStack_2464 = uVar41 ^ uStack_2564;
  fStack_249c = local_24a0;
  fStack_2498 = local_24a0;
  fStack_2494 = local_24a0;
  fStack_2490 = local_24a0;
  fStack_248c = local_24a0;
  fStack_2488 = local_24a0;
  fStack_2484 = local_24a0;
  local_24c0 = (uint)auVar52._0_4_ ^ local_2580;
  uStack_24bc = (uint)auVar52._0_4_ ^ uStack_257c;
  uStack_24b8 = (uint)auVar52._0_4_ ^ uStack_2578;
  uStack_24b4 = (uint)auVar52._0_4_ ^ uStack_2574;
  uStack_24b0 = (uint)auVar52._0_4_ ^ uStack_2570;
  uStack_24ac = (uint)auVar52._0_4_ ^ uStack_256c;
  uStack_24a8 = (uint)auVar52._0_4_ ^ uStack_2568;
  uStack_24a4 = (uint)auVar52._0_4_ ^ uStack_2564;
  auVar40 = vmovshdup_avx(auVar4);
  local_24e0 = auVar40._0_8_;
  uStack_24d8 = local_24e0;
  uStack_24d0 = local_24e0;
  uStack_24c8 = local_24e0;
  auVar40 = vmovshdup_avx(auVar52);
  uVar21 = auVar40._0_4_;
  uVar41 = auVar40._4_4_;
  local_2500 = uVar21 ^ local_2580;
  uStack_24fc = uVar41 ^ uStack_257c;
  uStack_24f8 = uVar21 ^ uStack_2578;
  uStack_24f4 = uVar41 ^ uStack_2574;
  uStack_24f0 = uVar21 ^ uStack_2570;
  uStack_24ec = uVar41 ^ uStack_256c;
  uStack_24e8 = uVar21 ^ uStack_2568;
  uStack_24e4 = uVar41 ^ uStack_2564;
  auVar40 = vshufps_avx(auVar4,auVar4,0xaa);
  local_2520 = auVar40._0_8_;
  uStack_2518 = local_2520;
  uStack_2510 = local_2520;
  uStack_2508 = local_2520;
  auVar40 = vshufps_avx(auVar52,auVar52,0xaa);
  uVar21 = auVar40._0_4_;
  uVar41 = auVar40._4_4_;
  local_2540 = uVar21 ^ local_2580;
  uStack_253c = uVar41 ^ uStack_257c;
  uStack_2538 = uVar21 ^ uStack_2578;
  uStack_2534 = uVar41 ^ uStack_2574;
  uStack_2530 = uVar21 ^ uStack_2570;
  uStack_252c = uVar41 ^ uStack_256c;
  uStack_2528 = uVar21 ^ uStack_2568;
  uStack_2524 = uVar41 ^ uStack_2564;
  local_2710._0_4_ = auVar48._0_4_;
  local_2560 = local_2710._0_4_;
  uStack_255c = local_2710._0_4_;
  uStack_2558 = local_2710._0_4_;
  uStack_2554 = local_2710._0_4_;
  uStack_2550 = local_2710._0_4_;
  uStack_254c = local_2710._0_4_;
  uStack_2548 = local_2710._0_4_;
  uStack_2544 = local_2710._0_4_;
  auVar40._4_4_ = uStack_260c;
  auVar40._0_4_ = local_2610;
  auVar40._8_4_ = uStack_2608;
  auVar40._12_4_ = uStack_2604;
  local_2710 = vblendvps_avx(auVar40,local_26b0,auVar37);
  auVar62 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  puVar27 = local_2390;
  local_26d8 = uVar30;
  do {
    local_23c0 = auVar46._0_4_;
    uStack_23bc = local_23c0;
    uStack_23b8 = local_23c0;
    uStack_23b4 = local_23c0;
    uStack_23b0 = local_23c0;
    uStack_23ac = local_23c0;
    uStack_23a8 = local_23c0;
    uStack_23a4 = local_23c0;
LAB_01687daf:
    do {
      do {
        do {
          if (puVar27 == &local_23a0) {
            if (local_26f0 == 0) {
              return;
            }
            goto LAB_016879bc;
          }
          uVar22 = (undefined4)puVar27[-1];
          auVar33._4_4_ = uVar22;
          auVar33._0_4_ = uVar22;
          auVar33._8_4_ = uVar22;
          auVar33._12_4_ = uVar22;
          auVar36 = ZEXT1664(auVar33);
          puVar27 = puVar27 + -2;
          auVar40 = vcmpps_avx(auVar33,local_2720,1);
        } while ((((auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar40[0xf]);
        uVar23 = *puVar27;
        while ((uVar23 & 8) == 0) {
          auVar18._4_4_ = uStack_23fc;
          auVar18._0_4_ = local_2400;
          auVar18._8_4_ = uStack_23f8;
          auVar18._12_4_ = uStack_23f4;
          auVar18._16_4_ = uStack_23f0;
          auVar18._20_4_ = uStack_23ec;
          auVar18._24_4_ = uStack_23e8;
          auVar18._28_4_ = uStack_23e4;
          auVar19._4_4_ = fStack_23dc;
          auVar19._0_4_ = local_23e0;
          auVar19._8_4_ = fStack_23d8;
          auVar19._12_4_ = fStack_23d4;
          auVar19._16_4_ = fStack_23d0;
          auVar19._20_4_ = fStack_23cc;
          auVar19._24_4_ = fStack_23c8;
          auVar19._28_4_ = fStack_23c4;
          auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar30),auVar18,auVar19);
          auVar7._8_8_ = uStack_2418;
          auVar7._0_8_ = local_2420;
          auVar7._16_8_ = uStack_2410;
          auVar7._24_8_ = uStack_2408;
          auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + local_26b8),local_2440,
                                    auVar7);
          auVar7 = vpmaxsd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar34));
          auVar16._4_4_ = uStack_247c;
          auVar16._0_4_ = local_2480;
          auVar16._8_4_ = uStack_2478;
          auVar16._12_4_ = uStack_2474;
          auVar16._16_4_ = uStack_2470;
          auVar16._20_4_ = uStack_246c;
          auVar16._24_4_ = uStack_2468;
          auVar16._28_4_ = uStack_2464;
          auVar17._8_8_ = uStack_2458;
          auVar17._0_8_ = local_2460;
          auVar17._16_8_ = uStack_2450;
          auVar17._24_8_ = uStack_2448;
          auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar32),auVar16,auVar17);
          auVar8._4_4_ = uStack_255c;
          auVar8._0_4_ = local_2560;
          auVar8._8_4_ = uStack_2558;
          auVar8._12_4_ = uStack_2554;
          auVar8._16_4_ = uStack_2550;
          auVar8._20_4_ = uStack_254c;
          auVar8._24_4_ = uStack_2548;
          auVar8._28_4_ = uStack_2544;
          auVar8 = vpmaxsd_avx2(ZEXT1632(auVar40),auVar8);
          auVar7 = vpmaxsd_avx2(auVar7,auVar8);
          auVar14._4_4_ = uStack_24bc;
          auVar14._0_4_ = local_24c0;
          auVar14._8_4_ = uStack_24b8;
          auVar14._12_4_ = uStack_24b4;
          auVar14._16_4_ = uStack_24b0;
          auVar14._20_4_ = uStack_24ac;
          auVar14._24_4_ = uStack_24a8;
          auVar14._28_4_ = uStack_24a4;
          auVar15._4_4_ = fStack_249c;
          auVar15._0_4_ = local_24a0;
          auVar15._8_4_ = fStack_2498;
          auVar15._12_4_ = fStack_2494;
          auVar15._16_4_ = fStack_2490;
          auVar15._20_4_ = fStack_248c;
          auVar15._24_4_ = fStack_2488;
          auVar15._28_4_ = fStack_2484;
          auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar31),auVar14,auVar15);
          auVar12._4_4_ = uStack_24fc;
          auVar12._0_4_ = local_2500;
          auVar12._8_4_ = uStack_24f8;
          auVar12._12_4_ = uStack_24f4;
          auVar12._16_4_ = uStack_24f0;
          auVar12._20_4_ = uStack_24ec;
          auVar12._24_4_ = uStack_24e8;
          auVar12._28_4_ = uStack_24e4;
          auVar13._8_8_ = uStack_24d8;
          auVar13._0_8_ = local_24e0;
          auVar13._16_8_ = uStack_24d0;
          auVar13._24_8_ = uStack_24c8;
          auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + local_26c0),auVar12,
                                    auVar13);
          auVar8 = vpminsd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar34));
          auVar9._4_4_ = uStack_253c;
          auVar9._0_4_ = local_2540;
          auVar9._8_4_ = uStack_2538;
          auVar9._12_4_ = uStack_2534;
          auVar9._16_4_ = uStack_2530;
          auVar9._20_4_ = uStack_252c;
          auVar9._24_4_ = uStack_2528;
          auVar9._28_4_ = uStack_2524;
          auVar11._8_8_ = uStack_2518;
          auVar11._0_8_ = local_2520;
          auVar11._16_8_ = uStack_2510;
          auVar11._24_8_ = uStack_2508;
          auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar32 ^ 0x20)),auVar9,
                                    auVar11);
          auVar20._4_4_ = uStack_23bc;
          auVar20._0_4_ = local_23c0;
          auVar20._8_4_ = uStack_23b8;
          auVar20._12_4_ = uStack_23b4;
          auVar20._16_4_ = uStack_23b0;
          auVar20._20_4_ = uStack_23ac;
          auVar20._24_4_ = uStack_23a8;
          auVar20._28_4_ = uStack_23a4;
          auVar9 = vpminsd_avx2(ZEXT1632(auVar40),auVar20);
          auVar8 = vpminsd_avx2(auVar8,auVar9);
          local_2660.valid = (int *)auVar7._0_8_;
          local_2660.geometryUserPtr = (void *)auVar7._8_8_;
          local_2660.primID = auVar7._16_4_;
          local_2660._20_4_ = auVar7._20_4_;
          local_2660.context = (RTCRayQueryContext *)auVar7._24_8_;
          auVar7 = vcmpps_avx(auVar7,auVar8,2);
          uVar21 = vmovmskps_avx(auVar7);
          if (uVar21 == 0) goto LAB_01687daf;
          uVar28 = (ulong)(uVar21 & 0xff);
          auVar36 = ZEXT1664(auVar62._0_16_);
          uVar29 = 0;
          uVar24 = 8;
          do {
            lVar10 = 0;
            for (uVar25 = uVar28; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar10 = lVar10 + 1;
            }
            uVar22 = *(undefined4 *)(uVar23 + 0x40 + lVar10 * 4);
            auVar37._4_4_ = uVar22;
            auVar37._0_4_ = uVar22;
            auVar37._8_4_ = uVar22;
            auVar37._12_4_ = uVar22;
            auVar33 = vfmadd213ps_fma(auVar37,auVar59._0_16_,auVar58._0_16_);
            uVar22 = *(undefined4 *)(uVar23 + 0x80 + lVar10 * 4);
            auVar39._4_4_ = uVar22;
            auVar39._0_4_ = uVar22;
            auVar39._8_4_ = uVar22;
            auVar39._12_4_ = uVar22;
            auVar4 = vfmadd213ps_fma(auVar39,auVar60._0_16_,auVar56._0_16_);
            uVar22 = *(undefined4 *)(uVar23 + 0xc0 + lVar10 * 4);
            auVar44._4_4_ = uVar22;
            auVar44._0_4_ = uVar22;
            auVar44._8_4_ = uVar22;
            auVar44._12_4_ = uVar22;
            auVar46 = vfmadd213ps_fma(auVar44,auVar61._0_16_,auVar57._0_16_);
            uVar22 = *(undefined4 *)(uVar23 + 0x60 + lVar10 * 4);
            auVar47._4_4_ = uVar22;
            auVar47._0_4_ = uVar22;
            auVar47._8_4_ = uVar22;
            auVar47._12_4_ = uVar22;
            auVar42 = vfmadd213ps_fma(auVar47,auVar59._0_16_,auVar58._0_16_);
            uVar22 = *(undefined4 *)(uVar23 + 0xa0 + lVar10 * 4);
            auVar50._4_4_ = uVar22;
            auVar50._0_4_ = uVar22;
            auVar50._8_4_ = uVar22;
            auVar50._12_4_ = uVar22;
            auVar43 = vfmadd213ps_fma(auVar50,auVar60._0_16_,auVar56._0_16_);
            uVar22 = *(undefined4 *)(uVar23 + 0xe0 + lVar10 * 4);
            auVar53._4_4_ = uVar22;
            auVar53._0_4_ = uVar22;
            auVar53._8_4_ = uVar22;
            auVar53._12_4_ = uVar22;
            auVar45 = vfmadd213ps_fma(auVar53,auVar61._0_16_,auVar57._0_16_);
            auVar40 = vpminsd_avx(auVar33,auVar42);
            auVar34 = vpminsd_avx(auVar4,auVar43);
            auVar40 = vpmaxsd_avx(auVar40,auVar34);
            auVar34 = vpminsd_avx(auVar46,auVar45);
            auVar34 = vpmaxsd_avx(auVar34,local_2710);
            auVar40 = vpmaxsd_avx(auVar40,auVar34);
            auVar34 = vpmaxsd_avx(auVar33,auVar42);
            auVar33 = vpmaxsd_avx(auVar4,auVar43);
            auVar33 = vpminsd_avx(auVar34,auVar33);
            auVar34 = vpmaxsd_avx(auVar46,auVar45);
            auVar34 = vpminsd_avx(auVar34,local_2720);
            auVar34 = vpminsd_avx(auVar33,auVar34);
            auVar40 = vcmpps_avx(auVar40,auVar34,2);
            uVar25 = uVar24;
            if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar40[0xf] < '\0') {
              uVar22 = *(undefined4 *)((long)&local_2660.valid + lVar10 * 4);
              auVar38._4_4_ = uVar22;
              auVar38._0_4_ = uVar22;
              auVar38._8_4_ = uVar22;
              auVar38._12_4_ = uVar22;
              uVar25 = *(ulong *)(uVar23 + lVar10 * 8);
              auVar34 = auVar36._0_16_;
              auVar40 = vcmpps_avx(auVar38,auVar34,1);
              if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar40[0xf]) {
                *puVar27 = uVar25;
                uVar25 = uVar24;
              }
              else {
                if (uVar24 == 8) {
                  auVar36 = ZEXT1664(auVar38);
                  goto LAB_01687fe1;
                }
                *puVar27 = uVar24;
                auVar36 = ZEXT1664(auVar38);
                auVar38 = auVar34;
              }
              uVar29 = uVar29 + 1;
              *(int *)(puVar27 + 1) = auVar38._0_4_;
              puVar27 = puVar27 + 2;
            }
LAB_01687fe1:
            uVar28 = uVar28 - 1 & uVar28;
            uVar24 = uVar25;
          } while (uVar28 != 0);
          if (uVar25 == 8) goto LAB_01687daf;
          uVar23 = uVar25;
          if (1 < uVar29) {
            puVar1 = puVar27 + -4;
            puVar2 = puVar27 + -2;
            if ((uint)puVar27[-3] < (uint)puVar27[-1]) {
              uVar24 = *puVar1;
              uVar28 = puVar27[-3];
              *(int *)(puVar27 + -3) = (int)puVar27[-1];
              *puVar1 = *puVar2;
              *puVar2 = uVar24;
              local_2730._8_4_ = (undefined4)uVar28;
              *(undefined4 *)(puVar27 + -1) = local_2730._8_4_;
            }
            if (uVar29 != 2) {
              puVar3 = puVar27 + -6;
              uVar21 = (uint)puVar27[-5];
              if (uVar21 < (uint)puVar27[-1]) {
                uVar24 = *puVar3;
                uVar28 = puVar27[-5];
                *(int *)(puVar27 + -5) = (int)puVar27[-1];
                *puVar3 = *puVar2;
                *puVar2 = uVar24;
                local_2730._8_4_ = (undefined4)uVar28;
                *(undefined4 *)(puVar27 + -1) = local_2730._8_4_;
                uVar21 = (uint)puVar27[-5];
              }
              if (uVar21 < (uint)puVar27[-3]) {
                uVar24 = *puVar3;
                uVar28 = puVar27[-5];
                *(int *)(puVar27 + -5) = (int)puVar27[-3];
                *puVar3 = *puVar1;
                *puVar1 = uVar24;
                local_2730._8_4_ = (undefined4)uVar28;
                *(undefined4 *)(puVar27 + -3) = local_2730._8_4_;
              }
            }
          }
        }
        local_2590 = vcmpps_avx(local_2720,auVar36._0_16_,6);
        auVar36 = ZEXT1664(local_2590);
      } while ((((local_2590 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (local_2590 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (local_2590 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < local_2590[0xf]);
      local_26d0 = (ulong)((uint)uVar23 & 0xf) - 8;
      for (local_26c8 = 0; auVar40 = auVar36._0_16_, local_26d0 != local_26c8;
          local_26c8 = local_26c8 + 1) {
        local_2660.geomID = *(uint *)((uVar23 & 0xfffffffffffffff0) + local_26c8 * 8);
        local_2630 = (context->scene->geometries).items[local_2660.geomID].ptr;
        uVar21 = local_2630->mask;
        auVar35._4_4_ = uVar21;
        auVar35._0_4_ = uVar21;
        auVar35._8_4_ = uVar21;
        auVar35._12_4_ = uVar21;
        auVar34 = vpand_avx(auVar35,*(undefined1 (*) [16])(ray + 0x90));
        auVar34 = vpcmpeqd_avx(auVar34,_DAT_01f45a50);
        auVar33 = auVar40 & ~auVar34;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          local_2730 = vandnps_avx(auVar34,auVar40);
          local_2660.geometryUserPtr = local_2630->userPtr;
          local_2660.valid = (int *)local_2730;
          auVar40 = (undefined1  [16])local_2660._0_16_;
          local_2660.context = context->user;
          local_2660.N = 4;
          local_2660.primID = *(undefined4 *)((uVar23 & 0xfffffffffffffff0) + 4 + local_26c8 * 8);
          local_2660._0_20_ = CONCAT416(local_2660.primID,auVar40);
          local_2628 = 0;
          local_2620 = context->args;
          pp_Var26 = (_func_int **)local_2620->intersect;
          if (pp_Var26 == (_func_int **)0x0) {
            pp_Var26 = local_2630[1].super_RefCount._vptr_RefCount;
          }
          local_2660.rayhit = (RTCRayHitN *)ray;
          (*(code *)pp_Var26)(&local_2660);
          auVar59 = ZEXT1664(local_25a0);
          auVar60 = ZEXT1664(local_25b0);
          auVar61 = ZEXT1664(local_25c0);
          auVar58 = ZEXT1664(CONCAT412(fStack_2674,
                                       CONCAT48(fStack_2678,CONCAT44(fStack_267c,local_2680))));
          auVar56 = ZEXT1664(CONCAT412(fStack_2684,
                                       CONCAT48(fStack_2688,CONCAT44(fStack_268c,local_2690))));
          auVar57 = ZEXT1664(CONCAT412(fStack_2694,
                                       CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
          auVar62 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar36 = ZEXT1664(local_2590);
          context = local_26e0;
          ray = local_26e8;
          uVar30 = local_26d8;
        }
      }
      auVar34 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_2720,1);
      auVar34 = auVar40 & auVar34;
    } while ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar34[0xf]);
    local_2720 = vblendvps_avx(local_2720,*(undefined1 (*) [16])(ray + 0x80),auVar40);
    auVar40 = vshufps_avx(local_2720,local_2720,0xb1);
    auVar40 = vmaxps_avx(auVar40,local_2720);
    auVar34 = vshufpd_avx(auVar40,auVar40,1);
    auVar46 = vmaxss_avx(auVar34,auVar40);
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }